

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFEFStreamObjectHelper::getSubtype_abi_cxx11_
          (string *__return_storage_ptr__,QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_61;
  string n;
  QPDFObjectHandle val;
  undefined1 local_30 [32];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x10),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&n,"/Subtype",&local_61);
  QPDFObjectHandle::getKey(&val,(string *)local_30);
  std::__cxx11::string::~string((string *)&n);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x18));
  bVar1 = QPDFObjectHandle::isName(&val);
  if (bVar1) {
    QPDFObjectHandle::getName_abi_cxx11_(&n,&val);
    if (1 < n._M_string_length) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&n);
      std::__cxx11::string::~string((string *)&n);
      goto LAB_00159984;
    }
    std::__cxx11::string::~string((string *)&n);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4a6d + 4,(allocator<char> *)&n);
LAB_00159984:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&val.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFEFStreamObjectHelper::getSubtype()
{
    auto val = oh().getDict().getKey("/Subtype");
    if (val.isName()) {
        auto n = val.getName();
        if (n.length() > 1) {
            return n.substr(1);
        }
    }
    return "";
}